

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv2maropu.cpp
# Opt level: O0

void print(externalvector *ev)

{
  ulong uVar1;
  size_t sVar2;
  size_type sVar3;
  reference pvVar4;
  ostream *poVar5;
  externalvector *in_RDI;
  size_t k;
  vector<unsigned_int,_std::allocator<unsigned_int>_> x;
  size_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffc0;
  ulong local_30;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  ulong local_10;
  externalvector *local_8;
  
  local_10 = 0;
  local_8 = in_RDI;
  while( true ) {
    uVar1 = local_10;
    sVar2 = FastPForLib::externalvector::size(local_8);
    if (sVar2 <= uVar1) break;
    FastPForLib::externalvector::get
              ((externalvector *)
               x.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (size_t)x.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start);
    local_30 = 0;
    while( true ) {
      sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_28);
      if (sVar3 <= local_30) break;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_28,local_30);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar4);
      std::operator<<(poVar5," ");
      local_30 = local_30 + 1;
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_ffffffffffffffc0);
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

void print(externalvector &ev) {
  for (size_t i = 0; i < ev.size(); ++i) {
    vector<uint32_t> x = ev.get(i);
    for (size_t k = 0; k < x.size(); ++k)
      cout << x[k] << " ";
    cout << endl;
  }
}